

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AnonymousProgramSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  AnonymousProgramSymbol *pAVar1;
  size_t in_RDX;
  Compilation *in_RSI;
  AnonymousProgramSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  
  pAVar1 = (AnonymousProgramSymbol *)allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,in_RDX);
  slang::ast::AnonymousProgramSymbol::AnonymousProgramSymbol(in_RDI,in_RSI,unaff_retaddr);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }